

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O2

string * __thiscall Message::diggest_abi_cxx11_(string *__return_storage_ptr__,Message *this)

{
  ostream *poVar1;
  stringstream ss;
  string sStack_1b8;
  stringstream local_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,(string *)&this->o);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::ostream::operator<<((ostream *)poVar1,this->c);
  std::__cxx11::stringbuf::str();
  sha256(__return_storage_ptr__,&sStack_1b8);
  std::__cxx11::string::~string((string *)&sStack_1b8);
  std::__cxx11::stringstream::~stringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string Message::diggest() {
    std::stringstream ss;
    ss << o << t << c;
    return sha256(ss.str());
}